

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

reference<mpt::layout> * __thiscall
mpt::unique_array<mpt::reference<mpt::layout>_>::insert
          (unique_array<mpt::reference<mpt::layout>_> *this,long pos)

{
  content<mpt::reference<mpt::layout>_> *pcVar1;
  buffer *this_00;
  type_traits *ptVar2;
  _func_int_void_ptr_void_ptr *p_Var3;
  bool bVar4;
  int iVar5;
  reference<mpt::layout> *prVar6;
  ulong uVar7;
  
  pcVar1 = (this->_ref)._ref;
  if (pcVar1 == (content<mpt::reference<mpt::layout>_> *)0x0) {
    uVar7 = 0;
  }
  else {
    uVar7 = (pcVar1->super_buffer)._used >> 3;
  }
  if (pos < 0) {
    pos = pos + uVar7;
    if (pos < 0) {
      return (reference<mpt::layout> *)0x0;
    }
  }
  else if (uVar7 <= (ulong)pos) {
    uVar7 = pos;
  }
  bVar4 = reserve(this,uVar7 + 1);
  if (bVar4) {
    this_00 = &((this->_ref)._ref)->super_buffer;
    prVar6 = (reference<mpt::layout> *)buffer::insert(this_00,pos << 3,8);
    if (prVar6 != (reference<mpt::layout> *)0x0) {
      ptVar2 = this_00->_content_traits;
      if (((ptVar2 != (type_traits *)0x0) &&
          (p_Var3 = ptVar2->init, p_Var3 != (_func_int_void_ptr_void_ptr *)0x0)) &&
         (iVar5 = (*p_Var3)(prVar6,(void *)0x0), -1 < iVar5)) {
        return prVar6;
      }
      prVar6->_ref = (layout *)0x0;
      return prVar6;
    }
  }
  return (reference<mpt::layout> *)0x0;
}

Assistant:

T *insert(long pos)
	{
		long len = length();
		if (pos < 0) {
			if ((pos += len) < 0) {
				return 0;
			}
		}
		else if (pos > len) {
			len = pos;
		}
		if (!reserve(len + 1)) {
			return 0;
		}
		content<T> *d = _ref.instance();
		/* inserted raw data is NOT initialized */
		void *ptr = d->insert(pos);
		if (!ptr) {
			return 0;
		}
		const struct type_traits *traits = d->content_traits();
		if (traits && traits->init && traits->init(ptr, 0) >= 0) {
			return static_cast<T *>(ptr);
		}
		return new (ptr) T;
	}